

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_list.c
# Opt level: O3

void ErrorList_internal_grammar_error(ErrorList *error_list)

{
  wchar_t *__dest;
  
  __dest = (wchar_t *)malloc(0xb8);
  wcscpy(__dest,anon_var_dwarf_e2f3);
  ErrorList_add(error_list,__dest,(Location_conflict)0xffffffffffffffff);
  ErrorList_jump_to_local_rescue_env(error_list);
  return;
}

Assistant:

void ErrorList_internal_grammar_error(ErrorList* error_list) {
    const wchar_t* const message = L"Internal grammar error";
    const int message_length = wcslen(message);
    wchar_t* text = (wchar_t*)malloc((message_length + 1) * sizeof(wchar_t*));
    wcscpy(text, message);
    Location location = {-1, -1};
    ErrorList_add(error_list, text, location);
    ErrorList_jump_to_local_rescue_env(error_list);
}